

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O1

void Cmd_rngseed(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 == 1) {
    pcVar3 = "Usage: rngseed get|set|clear\n";
  }
  else {
    pcVar3 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar3,"get");
    if (iVar2 == 0) {
      pcVar3 = "rngseed is %d\n";
      uVar1 = rngseed;
LAB_003a37dd:
      Printf(pcVar3,(ulong)uVar1);
      return;
    }
    pcVar3 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar3,"set");
    if (iVar2 == 0) {
      iVar2 = FCommandLine::argc(argv);
      if (iVar2 != 2) {
        pcVar3 = FCommandLine::operator[](argv,2);
        staticrngseed = atoi(pcVar3);
        use_staticrng = true;
        pcVar3 = "Static rngseed %d will be set for next game\n";
        uVar1 = staticrngseed;
        goto LAB_003a37dd;
      }
      pcVar3 = "You need to specify a value to set\n";
    }
    else {
      pcVar3 = FCommandLine::operator[](argv,1);
      iVar2 = strcasecmp(pcVar3,"clear");
      if (iVar2 != 0) {
        return;
      }
      use_staticrng = false;
      pcVar3 = "Static rngseed cleared\n";
    }
  }
  Printf(pcVar3);
  return;
}

Assistant:

CCMD(rngseed)
{
	if (argv.argc() == 1)
	{
		Printf("Usage: rngseed get|set|clear\n");
		return;
	}
	if (stricmp(argv[1], "get") == 0)
	{
		Printf("rngseed is %d\n", rngseed);
	}
	else if (stricmp(argv[1], "set") == 0)
	{
		if (argv.argc() == 2)
		{
			Printf("You need to specify a value to set\n");
		}
		else
		{
			staticrngseed = atoi(argv[2]);
			use_staticrng = true;
			Printf("Static rngseed %d will be set for next game\n", staticrngseed);
		}
	}
	else if (stricmp(argv[1], "clear") == 0)
	{
		use_staticrng = false;
		Printf("Static rngseed cleared\n");
	}
}